

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_verifier.cpp
# Opt level: O3

FUNCTION_RETURN license::os::verify_signature(string *stringToVerify,string *signatureB64)

{
  uint uVar1;
  int iVar2;
  BIO *pBVar3;
  RSA *key;
  EVP_PKEY *pkey;
  BIO_METHOD *type;
  BIO *append;
  EVP_MD_CTX *ctx;
  EVP_MD *type_00;
  int *piVar4;
  FUNCTION_RETURN FVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double dVar6;
  uchar pubKey [140];
  uchar buffer [512];
  undefined1 auStack_2c8 [144];
  uchar local_238 [520];
  
  memcpy(auStack_2c8,&DAT_0043bc00,0x8c);
  if (initialize()::initialized == '\0') {
    initialize()::initialized = '\x01';
    ERR_load_ERR_strings();
    OPENSSL_init_crypto(2,0);
    OPENSSL_init_crypto(0xc,0);
  }
  pBVar3 = BIO_new_mem_buf(auStack_2c8,0x8c);
  key = d2i_RSAPublicKey_bio(pBVar3,(RSA **)0x0);
  BIO_free(pBVar3);
  if (key == (RSA *)0x0) {
    piVar4 = __errno_location();
    dVar6 = extraout_XMM0_Qa_01;
    if (*piVar4 != 0) {
      strerror(*piVar4);
      dVar6 = extraout_XMM0_Qa_02;
    }
  }
  else {
    pkey = EVP_PKEY_new();
    EVP_PKEY_assign(pkey,6,key);
    type = BIO_f_base64();
    pBVar3 = BIO_new(type);
    append = BIO_new_mem_buf((signatureB64->_M_dataplus)._M_p,(int)signatureB64->_M_string_length);
    pBVar3 = BIO_push(pBVar3,append);
    BIO_set_flags(pBVar3,0x100);
    uVar1 = BIO_read(pBVar3,local_238,(int)signatureB64->_M_string_length);
    local_238[uVar1] = '\0';
    BIO_free_all(pBVar3);
    ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx != (EVP_MD_CTX *)0x0) {
      type_00 = EVP_sha256();
      iVar2 = EVP_DigestVerifyInit(ctx,(EVP_PKEY_CTX **)0x0,type_00,(ENGINE *)0x0,pkey);
      if (iVar2 == 1) {
        iVar2 = EVP_DigestVerifyUpdate
                          (ctx,(stringToVerify->_M_dataplus)._M_p,stringToVerify->_M_string_length);
        if (iVar2 == 1) {
          iVar2 = EVP_DigestVerifyFinal(ctx,local_238,(ulong)uVar1);
          FVar5 = FUNC_RET_OK;
          if (iVar2 != 1) {
            piVar4 = __errno_location();
            dVar6 = extraout_XMM0_Qa;
            if (*piVar4 != 0) {
              strerror(*piVar4);
              dVar6 = extraout_XMM0_Qa_00;
            }
            _log(dVar6);
            FVar5 = FUNC_RET_ERROR;
          }
          if (pkey != (EVP_PKEY *)0x0) {
            EVP_PKEY_free(pkey);
          }
          EVP_MD_CTX_free(ctx);
          return FVar5;
        }
        piVar4 = __errno_location();
        dVar6 = extraout_XMM0_Qa_07;
        if (*piVar4 != 0) {
          strerror(*piVar4);
          dVar6 = extraout_XMM0_Qa_08;
        }
        _log(dVar6);
      }
      else {
        piVar4 = __errno_location();
        dVar6 = extraout_XMM0_Qa_05;
        if (*piVar4 != 0) {
          strerror(*piVar4);
          dVar6 = extraout_XMM0_Qa_06;
        }
        _log(dVar6);
      }
      if (pkey != (EVP_PKEY *)0x0) {
        EVP_PKEY_free(pkey);
      }
      EVP_MD_CTX_free(ctx);
      return FUNC_RET_ERROR;
    }
    if (pkey != (EVP_PKEY *)0x0) {
      EVP_PKEY_free(pkey);
    }
    piVar4 = __errno_location();
    dVar6 = extraout_XMM0_Qa_03;
    if (*piVar4 != 0) {
      strerror(*piVar4);
      dVar6 = extraout_XMM0_Qa_04;
    }
  }
  _log(dVar6);
  return FUNC_RET_ERROR;
}

Assistant:

FUNCTION_RETURN verify_signature(const std::string& stringToVerify, const std::string& signatureB64) {
	EVP_MD_CTX* mdctx = NULL;
	const unsigned char pubKey[] = PUBLIC_KEY;
	int func_ret = 0;
	initialize();

	BIO* bio = BIO_new_mem_buf((void*)(pubKey), sizeof(pubKey));
	RSA* rsa = d2i_RSAPublicKey_bio(bio, NULL);
	BIO_free(bio);
	if (rsa == NULL) {
		LOG_ERROR("Error reading public key");
		return FUNC_RET_ERROR;
	}
	EVP_PKEY* pkey = EVP_PKEY_new();
	EVP_PKEY_assign_RSA(pkey, rsa);

	/*BIO* bo = BIO_new(BIO_s_mem());
	 BIO_write(bo, pubKey, strlen(pubKey));
	 RSA *key = 0;
	 PEM_read_bio_RSAPublicKey(bo, &key, 0, 0);
	 BIO_free(bo);*/

	// RSA* rsa = EVP_PKEY_get1_RSA( key );
	// RSA * pubKey = d2i_RSA_PUBKEY(NULL, <der encoded byte stream pointer>, <num bytes>);
	unsigned char buffer[512];
	BIO* b64 = BIO_new(BIO_f_base64());
	BIO* encoded_signature = BIO_new_mem_buf((const void*)signatureB64.c_str(), signatureB64.size());
	BIO* biosig = BIO_push(b64, encoded_signature);
	BIO_set_flags(biosig, BIO_FLAGS_BASE64_NO_NL);  // Do not use newlines to flush buffer
	unsigned int len = BIO_read(biosig, (void*)buffer, signatureB64.size());
	// Can test here if len == decodeLen - if not, then return an error
	buffer[len] = 0;

	BIO_free_all(biosig);

	/* Create the Message Digest Context */
	if (!(mdctx = EVP_MD_CTX_create())) {
		free_resources(pkey, mdctx);
		LOG_ERROR("Error creating context");
		return FUNC_RET_ERROR;
	}
	if (1 != EVP_DigestVerifyInit(mdctx, NULL, EVP_sha256(), NULL, pkey)) {
		LOG_ERROR("Error initializing digest");
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}

	func_ret = EVP_DigestVerifyUpdate(mdctx, (const void*)stringToVerify.c_str(), stringToVerify.size());
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
		free_resources(pkey, mdctx);
		return FUNC_RET_ERROR;
	}
	FUNCTION_RETURN result;
	func_ret = EVP_DigestVerifyFinal(mdctx, buffer, len);
	if (1 != func_ret) {
		LOG_ERROR("Error verifying digest %d", func_ret);
	}
	result = (1 == func_ret ? FUNC_RET_OK : FUNC_RET_ERROR);

	free_resources(pkey, mdctx);
	return result;
}